

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall
Clone_unitsImportedUnitsWithAdditionalUnit_Test::Clone_unitsImportedUnitsWithAdditionalUnit_Test
          (Clone_unitsImportedUnitsWithAdditionalUnit_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00116df8;
  return;
}

Assistant:

TEST(Clone, unitsImportedUnitsWithAdditionalUnit)
{
    auto u = libcellml::Units::create();

    auto import = libcellml::ImportSource::create();
    import->setUrl("some-other-model.xml");

    u->setId("unique_id");
    u->setName("units");
    u->setSourceUnits(import, "imported_units_name");
    u->addUnit(libcellml::Units::StandardUnit::LUMEN);
    u->addUnit("a", "milli", -2.0);

    auto uClone = u->clone();

    compareUnits(u, uClone);
}